

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O2

void __thiscall
duckdb::MultiFileFunction<duckdb::CSVMultiFileInfo>::MultiFileFunction
          (MultiFileFunction<duckdb::CSVMultiFileInfo> *this,string *name_p)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_61;
  LogicalType local_60;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(string *)name_p);
  LogicalType::LogicalType(&local_60,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_60;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,__l,&local_61);
  TableFunction::TableFunction
            (&this->super_TableFunction,&local_30,(vector<duckdb::LogicalType,_true> *)&local_48,
             MultiFileScan,MultiFileBind,MultiFileInitGlobal,MultiFileInitLocal);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  LogicalType::~LogicalType(&local_60);
  ::std::__cxx11::string::~string((string *)&local_30);
  (this->super_TableFunction).super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function
  ._vptr_Function = (_func_int **)&PTR__TableFunction_01792448;
  (this->super_TableFunction).cardinality = MultiFileCardinality;
  (this->super_TableFunction).table_scan_progress = MultiFileProgress;
  (this->super_TableFunction).get_partition_data = MultiFileGetPartitionData;
  (this->super_TableFunction).get_bind_info = MultiFileGetBindInfo;
  (this->super_TableFunction).projection_pushdown = true;
  (this->super_TableFunction).pushdown_complex_filter = MultiFileComplexFilterPushdown;
  (this->super_TableFunction).get_partition_info = MultiFileGetPartitionInfo;
  (this->super_TableFunction).get_virtual_columns = MultiFileGetVirtualColumns;
  (this->super_TableFunction).dynamic_to_string = MultiFileDynamicToString_abi_cxx11_;
  MultiFileReader::AddParameters(&this->super_TableFunction);
  return;
}

Assistant:

explicit MultiFileFunction(string name_p)
	    : TableFunction(std::move(name_p), {LogicalType::VARCHAR}, MultiFileScan, MultiFileBind, MultiFileInitGlobal,
	                    MultiFileInitLocal) {
		cardinality = MultiFileCardinality;
		table_scan_progress = MultiFileProgress;
		get_partition_data = MultiFileGetPartitionData;
		get_bind_info = MultiFileGetBindInfo;
		projection_pushdown = true;
		pushdown_complex_filter = MultiFileComplexFilterPushdown;
		get_partition_info = MultiFileGetPartitionInfo;
		get_virtual_columns = MultiFileGetVirtualColumns;
		dynamic_to_string = MultiFileDynamicToString;
		MultiFileReader::AddParameters(*this);
	}